

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::Subprocess::Start
          (Subprocess *this,string *program,SearchMode search_mode)

{
  int iVar1;
  __pid_t _Var2;
  char *pcVar3;
  LogMessage *pLVar4;
  int *piVar5;
  size_t sVar6;
  char *message;
  char *pcStack_a8;
  int ignored;
  LogMessage local_a0;
  Voidify local_89;
  char *local_88;
  char *argv [2];
  LogMessage local_68;
  Voidify local_55 [20];
  byte local_41;
  LogMessage local_40;
  Voidify local_2d;
  int local_2c;
  int local_28;
  int stdout_pipe [2];
  int stdin_pipe [2];
  SearchMode search_mode_local;
  string *program_local;
  Subprocess *this_local;
  
  iVar1 = pipe(stdout_pipe);
  local_41 = 0;
  if (iVar1 == -1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/subprocess.cc"
               ,0x135,"pipe(stdin_pipe) != -1");
    local_41 = 1;
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_2d,pLVar4);
  }
  if ((local_41 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  iVar1 = pipe(&local_2c);
  if (iVar1 == -1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/subprocess.cc"
               ,0x136,"pipe(stdout_pipe) != -1");
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
    absl::lts_20250127::log_internal::Voidify::operator&&(local_55,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_68);
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  local_88 = anon_unknown_1::portable_strdup(pcVar3);
  argv[0] = (char *)0x0;
  _Var2 = fork();
  this->child_pid_ = _Var2;
  if (this->child_pid_ == -1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_a0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/subprocess.cc"
               ,0x13c);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a0);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,(char (*) [7])"fork: ")
    ;
    piVar5 = __errno_location();
    pcStack_a8 = strerror(*piVar5);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<<char_*,_0>
                       (pLVar4,&stack0xffffffffffffff58);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_89,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_a0);
  }
  if (this->child_pid_ == 0) {
    dup2(stdout_pipe[0],0);
    dup2(local_28,1);
    close(stdout_pipe[0]);
    close(stdout_pipe[1]);
    close(local_2c);
    close(local_28);
    if (search_mode == SEARCH_PATH) {
      execvp(local_88,&local_88);
    }
    else if (search_mode == EXACT_NAME) {
      execv(local_88,&local_88);
    }
    pcVar3 = local_88;
    sVar6 = strlen(local_88);
    write(2,pcVar3,sVar6);
    sVar6 = strlen(
                  ": program not found or is not executable\nPlease specify a program using absolute path or make sure the program is available in your PATH system variable\n"
                  );
    write(2,
          ": program not found or is not executable\nPlease specify a program using absolute path or make sure the program is available in your PATH system variable\n"
          ,sVar6);
    _exit(1);
  }
  free(local_88);
  close(stdout_pipe[0]);
  close(local_28);
  this->child_stdin_ = stdout_pipe[1];
  this->child_stdout_ = local_2c;
  return;
}

Assistant:

void Subprocess::Start(const std::string& program, SearchMode search_mode) {
  // Note that we assume that there are no other threads, thus we don't have to
  // do crazy stuff like using socket pairs or avoiding libc locks.

  // [0] is read end, [1] is write end.
  int stdin_pipe[2];
  int stdout_pipe[2];

  ABSL_CHECK(pipe(stdin_pipe) != -1);
  ABSL_CHECK(pipe(stdout_pipe) != -1);

  char* argv[2] = {portable_strdup(program.c_str()), nullptr};

  child_pid_ = fork();
  if (child_pid_ == -1) {
    ABSL_LOG(FATAL) << "fork: " << strerror(errno);
  } else if (child_pid_ == 0) {
    // We are the child.
    dup2(stdin_pipe[0], STDIN_FILENO);
    dup2(stdout_pipe[1], STDOUT_FILENO);

    close(stdin_pipe[0]);
    close(stdin_pipe[1]);
    close(stdout_pipe[0]);
    close(stdout_pipe[1]);

    switch (search_mode) {
      case SEARCH_PATH:
        execvp(argv[0], argv);
        break;
      case EXACT_NAME:
        execv(argv[0], argv);
        break;
    }

    // Write directly to STDERR_FILENO to avoid stdio code paths that may do
    // stuff that is unsafe here.
    int ignored;
    ignored = write(STDERR_FILENO, argv[0], strlen(argv[0]));
    const char* message =
        ": program not found or is not executable\n"
        "Please specify a program using absolute path or make sure "
        "the program is available in your PATH system variable\n";
    ignored = write(STDERR_FILENO, message, strlen(message));
    (void)ignored;

    // Must use _exit() rather than exit() to avoid flushing output buffers
    // that will also be flushed by the parent.
    _exit(1);
  } else {
    free(argv[0]);

    close(stdin_pipe[0]);
    close(stdout_pipe[1]);

    child_stdin_ = stdin_pipe[1];
    child_stdout_ = stdout_pipe[0];
  }
}